

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

int FFSinternal_decode(FFSTypeHandle_conflict ioformat,char *src,void *dest,int to_buffer)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  FMFormat_conflict p_Var4;
  FFSContext p_Var5;
  size_t sVar6;
  bool bVar7;
  ssize_t sVar8;
  ssize_t sVar9;
  ssize_t sVar10;
  long lVar11;
  char *final_string_base;
  char *pcVar12;
  char *pcVar13;
  size_t __n;
  int iVar14;
  ulong uVar15;
  ulong size;
  char *in_R8;
  char *__dest;
  _FFSBuffer *buf;
  FFSTypeHandle_conflict p_Var16;
  _IOConversionStruct *conv;
  char *dest_00;
  int record_len;
  IOConversionStruct null_conv;
  undefined8 local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  ssize_t local_138;
  long local_130;
  char *local_128;
  FFSTypeHandle_conflict local_120;
  ulong local_118;
  double local_110;
  _IOConversionStruct local_108;
  
  p_Var4 = ioformat->body;
  uVar2 = (p_Var4->server_ID).length;
  __dest = (char *)(ulong)uVar2;
  if (p_Var4->variant != 0) {
    if (p_Var4->IOversion < 4) {
      __dest = (char *)(ulong)(uVar2 + 4);
    }
    else {
      __dest = (char *)(ulong)(uVar2 + 8);
    }
  }
  p_Var5 = ioformat->context;
  conv = ioformat->conversion;
  if (conv == (IOConversionPtr_conflict)0x0) {
    conv = &local_108;
    local_108.conversion_type = none_required;
    in_R8 = (char *)0x3ff0000000000000;
    local_108.max_var_expansion = 1.0;
    local_108.conv_count = 0;
    local_108.base_size_delta = 0;
    local_108.context = p_Var5;
    local_108.ioformat = ioformat;
    local_108.native_field_list = (FMFieldList)0x0;
  }
  if (p_Var5 != conv->context) {
    FFSinternal_decode_cold_1();
    return -1;
  }
  iVar14 = (-(int)__dest & 7U) + (int)__dest;
  local_158 = (char *)CONCAT44(local_158._4_4_,to_buffer);
  if (p_Var4->variant == 0) {
    local_130 = (long)p_Var4->record_length;
  }
  else if (p_Var4->IOversion < 4) {
    local_160 = CONCAT44(local_160._4_4_,
                         *(undefined4 *)(src + (ulong)(-uVar2 & 3) + (long)(int)uVar2));
    if (p_Var4->byte_reversal != 0) {
      pcVar12 = (char *)((long)&local_160 + 3);
      __dest = (char *)0x0;
      do {
        cVar1 = *(char *)((long)&local_160 + (long)__dest);
        in_R8 = (char *)CONCAT71((int7)((ulong)in_R8 >> 8),*pcVar12);
        *(char *)((long)&local_160 + (long)__dest) = *pcVar12;
        *pcVar12 = cVar1;
        __dest = __dest + 1;
        pcVar12 = pcVar12 + -1;
      } while (__dest != (char *)0x2);
    }
    local_130 = (long)(int)local_160;
  }
  else {
    local_160 = *(long *)(src + (int)uVar2);
    local_130 = local_160;
    if (p_Var4->byte_reversal != 0) {
      pcVar12 = (char *)((long)&local_160 + 7);
      __dest = (char *)0x0;
      do {
        cVar1 = *(char *)((long)&local_160 + (long)__dest);
        in_R8 = (char *)CONCAT71((int7)((ulong)in_R8 >> 8),*pcVar12);
        *(char *)((long)&local_160 + (long)__dest) = *pcVar12;
        *pcVar12 = cVar1;
        __dest = __dest + 1;
        pcVar12 = pcVar12 + -1;
        local_130 = local_160;
      } while (__dest != (char *)0x4);
    }
  }
  iVar3 = p_Var4->record_length;
  local_118 = (ulong)(-iVar3 & 7);
  local_140 = src + (int)((-iVar14 & 7U) + iVar14);
  local_128 = local_140 + local_118 + (long)iVar3;
  sVar6 = conv->base_size_delta;
  uVar15 = (ulong)(int)(iVar3 + 7U & 0xfffffff8);
  local_110 = (double)(local_130 - conv->ioformat->body->record_length) * conv->max_var_expansion;
  buf = &p_Var5->tmp;
  sVar8 = 0;
  local_150 = (char *)dest;
  local_148 = src;
  local_120 = ioformat;
  make_tmp_buffer(buf,0);
  pcVar12 = local_150;
  if (local_150 == (char *)0x0) {
    size = sVar6 + 7 + (long)iVar3 & 0xfffffffffffffff8;
    if (size <= uVar15) {
      size = uVar15;
    }
    final_string_base = local_150;
    dest_00 = local_150;
    sVar8 = add_to_tmp_buffer(buf,size);
    if (sVar8 == -1) {
      bVar7 = true;
      p_Var16 = local_120;
      goto LAB_0010ec39;
    }
    pcVar12 = (char *)0x0;
  }
  p_Var16 = local_120;
  sVar9 = sVar8;
  __dest = pcVar12;
  if (conv->conversion_type < buffer_and_convert) {
LAB_0010eb03:
    iVar14 = p_Var16->body->record_length;
    if (local_150 == (char *)0x0 || (int)local_158 == 0) {
      final_string_base = (char *)(long)(int)local_110;
      pcVar13 = (char *)(local_130 - uVar15);
      if ((long)(local_130 - uVar15) <= (long)final_string_base) {
        pcVar13 = final_string_base;
      }
      dest_00 = pcVar12;
      local_158 = __dest;
      local_138 = sVar8;
      sVar10 = add_to_tmp_buffer(buf,(ulong)(pcVar13 + (ulong)(-iVar14 & 7) + 7) &
                                     0xfffffffffffffff8);
      if (sVar10 == -1) goto LAB_0010ec23;
      final_string_base = (char *)0x0;
      __dest = local_158;
      sVar8 = local_138;
    }
    else {
      final_string_base =
           local_150 + ((long)iVar14 + conv->base_size_delta + 7 & 0xfffffffffffffff8);
      sVar10 = 0;
    }
    lVar11 = sVar10;
    in_R8 = final_string_base;
    dest_00 = pcVar12;
    if (buffer_and_convert < conv->conversion_type) {
      if ((local_148 == (char *)0x0) || (local_140 == pcVar12)) {
        local_158 = __dest;
        local_150 = final_string_base;
        local_148 = pcVar12;
        lVar11 = add_to_tmp_buffer(buf,(local_130 - p_Var16->body->record_length) + 8);
        dest_00 = pcVar12;
        if (lVar11 == -1) goto LAB_0010ec23;
        in_R8 = (char *)0x0;
        final_string_base = local_150;
        __dest = local_158;
        dest_00 = local_148;
      }
      else {
        lVar11 = 0;
        in_R8 = local_128;
      }
    }
    if (dest_00 == (char *)0x0) {
      dest_00 = (char *)(sVar8 + (long)buf->tmp_buffer);
    }
    if (__dest == (char *)0x0) {
      __dest = (char *)(sVar9 + (long)buf->tmp_buffer);
    }
    if (final_string_base == (char *)0x0) {
      final_string_base = (char *)(sVar10 + (long)buf->tmp_buffer);
    }
    if (in_R8 == (char *)0x0) {
      in_R8 = (char *)(lVar11 + (long)buf->tmp_buffer);
      bVar7 = false;
    }
    else {
      bVar7 = false;
    }
  }
  else {
    if ((local_148 != (char *)0x0) && (local_140 != pcVar12)) {
      sVar9 = 0;
      __dest = local_140;
      goto LAB_0010eb03;
    }
    final_string_base = local_150;
    dest_00 = pcVar12;
    local_138 = sVar8;
    sVar9 = add_to_tmp_buffer(buf,(long)(int)(local_120->body->record_length + 7U & 0xfffffff8));
    if (sVar9 != -1) {
      __dest = (char *)0x0;
      sVar8 = local_138;
      goto LAB_0010eb03;
    }
LAB_0010ec23:
    bVar7 = true;
  }
LAB_0010ec39:
  iVar14 = 0;
  if (!bVar7) {
    if (__dest != local_140) {
      memcpy(__dest,local_140,(long)p_Var16->body->record_length);
    }
    if ((in_R8 != local_128) &&
       (__n = local_130 - (local_118 + (long)p_Var16->body->record_length), 0 < (long)__n)) {
      memcpy(in_R8,local_128,__n);
    }
    iVar14 = 1;
    if (conv->conversion_type != none_required) {
      FFSconvert_record(conv,__dest,dest_00,final_string_base,in_R8);
    }
  }
  return iVar14;
}

Assistant:

static int
FFSinternal_decode(FFSTypeHandle ioformat, char *src, void *dest, int to_buffer)
{
    FFSContext iofile = ioformat->context;
    IOConversionPtr conv;
    int64_t input_record_len;
    IOConversionStruct null_conv;
    int align_pad;
    int header_size = FFSheader_size(ioformat);
    int data_align_pad;
    conversion_action params;

    conv = ioformat->conversion;

    if (conv == NULL) {
	null_conv.conversion_type = none_required;
	null_conv.max_var_expansion = 1.0;
	null_conv.conv_count = 0;
	null_conv.base_size_delta = 0;
	null_conv.context = iofile;
	null_conv.ioformat = ioformat;
	null_conv.native_field_list = NULL;
	conv = &null_conv;
    }
    if (iofile != conv->context) {
	fprintf(stderr, "IOFile and conversion mismatch\n");
	return -1;
    }
    if (ioformat == NULL)
	return 0;

    if (ioformat->body->variant) {
	if (ioformat->body->IOversion <= 3) {
	    FILE_INT record_len;
	    int len_align_pad = (4 - ioformat->body->server_ID.length) & 3;
	    FILE_INT *len_ptr = (FILE_INT *) (src + ioformat->body->server_ID.length +
					      len_align_pad);
	    memcpy(&record_len, len_ptr, 4);
	    if (ioformat->body->byte_reversal)
		byte_swap((char *) &record_len, 4);
	    input_record_len = record_len;
	} else {
	    uint64_t record_len;
	    uint64_t *len_ptr = (uint64_t *) (src + ioformat->body->server_ID.length);
	    memcpy(&record_len, len_ptr, 8);
	    if (ioformat->body->byte_reversal)
		byte_swap((char *) &record_len, 8);
	    input_record_len = record_len;
	}
    } else {
	input_record_len = ioformat->body->record_length;
    }
    align_pad = (8 - header_size) & 0x7;
    header_size += align_pad;
    data_align_pad = (8 - ioformat->body->record_length) & 0x7;

    params.cur_base = src + header_size;
    params.cur_variant = params.cur_base + ioformat->body->record_length +
	data_align_pad;
    params.final_base = dest;
    params.variant_with_base = to_buffer;
    if (!set_conversion_params(ioformat, input_record_len, conv, &params))
	return 0;

    /* update stats 
    iofile->stats.decode_bytes += input_record_len;
    iofile->stats.decode_msg_count++;*/

    if (params.src_address != params.cur_base) {
	memcpy(params.src_address, params.cur_base, ioformat->body->record_length);
    }
    if (params.src_string_address != params.cur_variant) {
	if (input_record_len - ioformat->body->record_length - data_align_pad > 0) {
	    memcpy(params.src_string_address, params.cur_variant,
		   input_record_len - ioformat->body->record_length - data_align_pad);
	}
    }
    if (conv->conversion_type != none_required) {
	FFSconvert_record(conv, params.src_address, params.dest_address,
			 params.final_string_address,
			 params.src_string_address);
    }
    return 1;
}